

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O1

int ur_kinematics::inverse(double *T,double *q_sols,double q6_des)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double q4 [2];
  double q2 [2];
  double q3 [2];
  double q5 [2] [2];
  ulong uStack_210;
  undefined4 local_208;
  uint uStack_204;
  double local_1b8 [4];
  double local_198;
  double local_190;
  double local_188;
  ulong uStack_180;
  double local_178;
  ulong uStack_170;
  double local_168 [4];
  undefined1 local_148 [16];
  double local_138;
  ulong uStack_130;
  double local_128;
  ulong uStack_120;
  double local_110;
  double local_108;
  double local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  double local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48 [4];
  
  local_128 = *T;
  local_198 = T[1];
  local_1b8[3] = T[2];
  local_188 = T[3];
  local_138 = T[4];
  local_d8 = T[5];
  uStack_d0 = 0;
  local_e8 = T[6];
  uStack_e0 = 0;
  dVar1 = T[7];
  uStack_130 = 0;
  dVar20 = dVar1 - local_138 * 0.0996;
  uStack_120 = 0;
  uStack_180 = 0;
  dVar19 = local_188 - local_128 * 0.0996;
  local_148._8_8_ = 0;
  local_148._0_8_ = T[8];
  local_178 = T[9];
  uStack_170 = 0;
  local_f8 = T[10];
  uStack_f0 = 0;
  dVar2 = T[0xb];
  local_110 = q6_des;
  if (1e-08 <= ABS(dVar20)) {
    if (1e-08 <= ABS(dVar19)) {
      dVar5 = dVar20 * dVar20 + dVar19 * dVar19;
      if (dVar5 < 0.01776889) {
        return 0;
      }
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = acos(0.1333 / dVar5);
      dVar19 = atan2(-dVar19,dVar20);
      dVar20 = (double)(~-(ulong)(ABS(dVar5 + dVar19) < 1e-08) & (ulong)(dVar5 + dVar19));
      local_1b8[1] = (double)(~-(ulong)(ABS(dVar19 - dVar5) < 1e-08) & (ulong)(dVar19 - dVar5));
      local_1b8[0] = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                             (ulong)(dVar20 + 6.28318530717958) & -(ulong)(dVar20 < 0.0));
      if (local_1b8[1] < 0.0) {
        local_1b8[1] = local_1b8[1] + 6.28318530717958;
      }
    }
    else {
      if (1e-08 <= ABS(0.1333 - ABS(dVar20))) {
        dVar20 = 0.1333 / dVar20;
      }
      else {
        dVar20 = (double)(int)((uint)(0.0 < dVar20) - (uint)(dVar20 < 0.0));
      }
      local_1b8[0] = acos(dVar20);
      local_1b8[1] = 6.28318530717958 - local_1b8[0];
    }
  }
  else {
    if (1e-08 <= ABS(0.1333 - ABS(dVar19))) {
      dVar19 = -0.1333 / dVar19;
    }
    else {
      dVar19 = (double)(int)((uint)(dVar19 < 0.0) - (uint)(0.0 < dVar19));
    }
    local_1b8[1] = asin(dVar19);
    local_1b8[1] = (double)(~-(ulong)(ABS(local_1b8[1]) < 1e-08) & (ulong)local_1b8[1]);
    local_1b8[0] = (double)(~-(ulong)(local_1b8[1] < 0.0) & (ulong)local_1b8[1] |
                           (ulong)(local_1b8[1] + 6.28318530717958) & -(ulong)(local_1b8[1] < 0.0));
    local_1b8[1] = 3.14159265358979 - local_1b8[1];
  }
  local_128 = -local_128;
  uStack_120 = uStack_120 ^ 0x8000000000000000;
  local_188 = -local_188;
  uStack_180 = uStack_180 ^ 0x8000000000000000;
  local_138 = -local_138;
  uStack_130 = uStack_130 ^ 0x8000000000000000;
  local_208 = SUB84(dVar1,0);
  uStack_204 = (uint)((ulong)dVar1 >> 0x20);
  local_58 = local_208;
  uStack_54 = uStack_204 ^ 0x80000000;
  uStack_50 = 0;
  uStack_4c = 0x80000000;
  local_178 = -local_178;
  uStack_170 = uStack_170 ^ 0x8000000000000000;
  local_68 = (undefined4)local_f8;
  uStack_64 = local_f8._4_4_ ^ 0x80000000;
  uStack_60 = (int)uStack_f0;
  uStack_5c = (uint)((ulong)uStack_f0 >> 0x20) ^ 0x80000000;
  lVar14 = 0;
  do {
    dVar19 = *(double *)((long)local_1b8 + lVar14);
    dVar20 = sin(dVar19);
    dVar19 = cos(dVar19);
    dVar19 = dVar20 * local_188 + dVar19 * dVar1 + -0.1333;
    if (1e-08 <= ABS(ABS(dVar19) + -0.0996)) {
      dVar19 = dVar19 / 0.0996;
    }
    else {
      dVar19 = (double)(int)((uint)(0.0 < dVar19) - (uint)(dVar19 < 0.0));
    }
    dVar19 = acos(dVar19);
    *(double *)((long)local_48 + lVar14 * 2) = dVar19;
    *(double *)((long)local_48 + lVar14 * 2 + 8) = 6.28318530717958 - dVar19;
    lVar14 = lVar14 + 8;
  } while (lVar14 == 8);
  local_78._8_4_ = local_148._8_4_;
  local_78._0_8_ = -local_148._0_8_;
  local_78._12_4_ = local_148._12_4_ ^ 0x80000000;
  auVar3._8_4_ = local_148._8_4_;
  auVar3._0_8_ = local_148._0_8_ * -0.0996 + dVar2 + -0.1625;
  auVar3._12_4_ = local_148._12_4_;
  local_148 = auVar3;
  local_98._8_4_ = (int)uStack_e0;
  local_98._0_8_ = -local_e8;
  local_98._12_4_ = (uint)((ulong)uStack_e0 >> 0x20) ^ 0x80000000;
  local_88._8_4_ = (int)uStack_d0;
  local_88._0_8_ = -local_d8;
  local_88._12_4_ = (uint)((ulong)uStack_d0 >> 0x20) ^ 0x80000000;
  iVar12 = 0;
  lVar14 = 0;
  do {
    dVar1 = local_1b8[lVar14];
    lVar13 = 0;
    do {
      dVar2 = cos(dVar1);
      dVar19 = sin(dVar1);
      local_190 = local_48[lVar14 * 2 + lVar13];
      dVar20 = cos(local_190);
      dVar5 = sin(local_190);
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._0_8_ = dVar5;
      auVar4._12_4_ = extraout_XMM0_Dd;
      uVar16 = 0;
      uVar17 = 0;
      dVar8 = local_110;
      if (1e-08 <= ABS(dVar5)) {
        dVar8 = (double)(int)((uint)(0.0 < dVar5) - (uint)(dVar5 < 0.0));
        dVar8 = atan2(-(local_1b8[3] * dVar19 + dVar2 * (double)local_98._0_8_) * dVar8,
                      (local_198 * dVar19 + dVar2 * (double)local_88._0_8_) * dVar8);
        dVar8 = (double)(~-(ulong)(ABS(dVar8) < 1e-08) & (ulong)dVar8);
        uVar7 = ~(CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) & 0x7fffffffffffffff) &
                CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
        uVar16 = (undefined4)uVar7;
        uVar17 = (undefined4)(uVar7 >> 0x20);
        if (dVar8 < 0.0) {
          dVar8 = dVar8 + 6.28318530717958;
        }
      }
      local_b8._8_4_ = uVar16;
      local_b8._0_8_ = dVar8;
      local_b8._12_4_ = uVar17;
      dVar8 = cos(dVar8);
      dVar6 = sin((double)local_b8._0_8_);
      dVar21 = local_128 * dVar2 + dVar19 * local_138;
      dVar9 = local_1b8[3] * dVar2 + local_e8 * dVar19;
      dVar18 = local_198 * dVar2 + local_d8 * dVar19;
      dVar22 = dVar19 * (double)CONCAT44(uStack_54,local_58) +
               dVar2 * local_188 + (dVar6 * dVar18 + dVar9 * dVar8) * 0.0997 + dVar21 * -0.0996;
      dVar19 = ((double)CONCAT44(uStack_64,local_68) * dVar8 + dVar6 * local_178) * 0.0997 +
               (double)local_148._0_8_;
      dVar2 = (dVar22 * dVar22 + dVar19 * dVar19 + -0.18062499999999998 + -0.15382084) / 0.33337;
      if (1e-08 <= ABS(ABS(dVar2) + -1.0)) {
        if (ABS(dVar2) <= 1.0) goto LAB_00116ba8;
      }
      else {
        dVar2 = (double)(int)((uint)(0.0 < dVar2) - (uint)(dVar2 < 0.0));
LAB_00116ba8:
        uStack_210 = auVar4._8_8_;
        uStack_c0 = uStack_210 ^ 0x8000000000000000;
        local_c8 = -dVar5 * dVar21 - (dVar9 * dVar6 - dVar18 * dVar8) * dVar20;
        dVar21 = (dVar8 * local_178 + dVar6 * local_f8) * dVar20 + dVar5 * (double)local_78._0_8_;
        dVar20 = acos(dVar2);
        dVar5 = dVar2 * 0.33337 + 0.33444584;
        local_a8[0] = dVar20;
        local_a8[1] = 6.28318530717958 - dVar20;
        dVar8 = sin(dVar20);
        dVar6 = dVar2 * -0.3922 + -0.425;
        local_108 = dVar22 * dVar8 * -0.3922;
        local_100 = dVar6 * dVar19;
        dVar19 = dVar8 * -0.3922 * dVar19;
        dVar6 = dVar6 * dVar22;
        dVar2 = atan2((local_100 - local_108) / dVar5,(dVar6 + dVar19) / dVar5);
        local_168[2] = dVar2;
        dVar19 = atan2((local_100 + local_108) / dVar5,(dVar6 - dVar19) / dVar5);
        local_168[3] = dVar19;
        dVar5 = cos(dVar20 + dVar2);
        dVar2 = sin(dVar20 + dVar2);
        dVar19 = (6.28318530717958 - dVar20) + dVar19;
        dVar20 = cos(dVar19);
        dVar19 = sin(dVar19);
        local_168[0] = atan2(dVar5 * dVar21 - local_c8 * dVar2,dVar2 * dVar21 + local_c8 * dVar5);
        local_168[1] = atan2(dVar20 * dVar21 - local_c8 * dVar19,dVar21 * dVar19 + local_c8 * dVar20
                            );
        pdVar10 = q_sols + (long)iVar12 * 6 + 5;
        lVar11 = 0;
        do {
          dVar2 = local_168[lVar11 + 2];
          dVar19 = 0.0;
          if (ABS(dVar2) < 1e-08) {
LAB_00116eba:
            local_168[lVar11 + 2] = dVar19;
          }
          else if (dVar2 < 0.0) {
            dVar19 = dVar2 + 6.28318530717958;
            goto LAB_00116eba;
          }
          dVar2 = local_168[lVar11];
          dVar19 = 0.0;
          if (ABS(dVar2) < 1e-08) {
LAB_00116eec:
            local_168[lVar11] = dVar19;
          }
          else if (dVar2 < 0.0) {
            dVar19 = dVar2 + 6.28318530717958;
            goto LAB_00116eec;
          }
          pdVar10[-5] = dVar1;
          pdVar10[-4] = local_168[lVar11 + 2];
          pdVar10[-3] = local_a8[lVar11];
          pdVar10[-2] = local_168[lVar11];
          pdVar10[-1] = local_190;
          *pdVar10 = (double)local_b8._0_8_;
          lVar11 = lVar11 + 1;
          pdVar10 = pdVar10 + 6;
        } while (lVar11 == 1);
        iVar12 = iVar12 + (int)lVar11;
      }
      bVar15 = lVar13 == 0;
      lVar13 = lVar13 + 1;
    } while (bVar15);
    bVar15 = lVar14 != 0;
    lVar14 = lVar14 + 1;
    if (bVar15) {
      return iVar12;
    }
  } while( true );
}

Assistant:

int inverse(const double* T, double* q_sols, double q6_des) {
    int num_sols = 0;
    double T02 = -*T; T++; double T00 =  *T; T++; double T01 =  *T; T++; double T03 = -*T; T++;
    double T12 = -*T; T++; double T10 =  *T; T++; double T11 =  *T; T++; double T13 = -*T; T++;
    double T22 =  *T; T++; double T20 = -*T; T++; double T21 = -*T; T++; double T23 =  *T;

    ////////////////////////////// shoulder rotate joint (q1) //////////////////////////////
    double q1[2];
    {
      double A = d6*T12 - T13;
      double B = d6*T02 - T03;
      double R = A*A + B*B;
      if(fabs(A) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(B)) < ZERO_THRESH)
          div = -SIGN(d4)*SIGN(B);
        else
          div = -d4/B;
        double arcsin = asin(div);
        if(fabs(arcsin) < ZERO_THRESH)
          arcsin = 0.0;
        if(arcsin < 0.0)
          q1[0] = arcsin + 2.0*PI;
        else
          q1[0] = arcsin;
        q1[1] = PI - arcsin;
      }
      else if(fabs(B) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(A)) < ZERO_THRESH)
          div = SIGN(d4)*SIGN(A);
        else
          div = d4/A;
        double arccos = acos(div);
        q1[0] = arccos;
        q1[1] = 2.0*PI - arccos;
      }
      else if(d4*d4 > R) {
        return num_sols;
      }
      else {
        double arccos = acos(d4 / sqrt(R)) ;
        double arctan = atan2(-B, A);
        double pos = arccos + arctan;
        double neg = -arccos + arctan;
        if(fabs(pos) < ZERO_THRESH)
          pos = 0.0;
        if(fabs(neg) < ZERO_THRESH)
          neg = 0.0;
        if(pos >= 0.0)
          q1[0] = pos;
        else
          q1[0] = 2.0*PI + pos;
        if(neg >= 0.0)
          q1[1] = neg;
        else
          q1[1] = 2.0*PI + neg;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    ////////////////////////////// wrist 2 joint (q5) //////////////////////////////
    double q5[2][2];
    {
      for(int i=0;i<2;i++) {
        double numer = (T03*sin(q1[i]) - T13*cos(q1[i])-d4);
        double div;
        if(fabs(fabs(numer) - fabs(d6)) < ZERO_THRESH)
          div = SIGN(numer) * SIGN(d6);
        else
          div = numer / d6;
        double arccos = acos(div);
        q5[i][0] = arccos;
        q5[i][1] = 2.0*PI - arccos;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    {
      for(int i=0;i<2;i++) {
        for(int j=0;j<2;j++) {
          double c1 = cos(q1[i]), s1 = sin(q1[i]);
          double c5 = cos(q5[i][j]), s5 = sin(q5[i][j]);
          double q6;
          ////////////////////////////// wrist 3 joint (q6) //////////////////////////////
          if(fabs(s5) < ZERO_THRESH)
            q6 = q6_des;
          else {
            q6 = atan2(SIGN(s5)*-(T01*s1 - T11*c1),
                       SIGN(s5)*(T00*s1 - T10*c1));
            if(fabs(q6) < ZERO_THRESH)
              q6 = 0.0;
            if(q6 < 0.0)
              q6 += 2.0*PI;
          }
          ////////////////////////////////////////////////////////////////////////////////

          double q2[2], q3[2], q4[2];
          ///////////////////////////// RRR joints (q2,q3,q4) ////////////////////////////
          double c6 = cos(q6), s6 = sin(q6);
          double x04x = -s5*(T02*c1 + T12*s1) - c5*(s6*(T01*c1 + T11*s1) - c6*(T00*c1 + T10*s1));
          double x04y = c5*(T20*c6 - T21*s6) - T22*s5;
          double p13x = d5*(s6*(T00*c1 + T10*s1) + c6*(T01*c1 + T11*s1)) - d6*(T02*c1 + T12*s1) +
                        T03*c1 + T13*s1;
          double p13y = T23 - d1 - d6*T22 + d5*(T21*c6 + T20*s6);

          double c3 = (p13x*p13x + p13y*p13y - a2*a2 - a3*a3) / (2.0*a2*a3);
          if(fabs(fabs(c3) - 1.0) < ZERO_THRESH)
            c3 = SIGN(c3);
          else if(fabs(c3) > 1.0) {
            // TODO NO SOLUTION
            continue;
          }
          double arccos = acos(c3);
          q3[0] = arccos;
          q3[1] = 2.0*PI - arccos;
          double denom = a2*a2 + a3*a3 + 2*a2*a3*c3;
          double s3 = sin(arccos);
          double A = (a2 + a3*c3), B = a3*s3;
          q2[0] = atan2((A*p13y - B*p13x) / denom, (A*p13x + B*p13y) / denom);
          q2[1] = atan2((A*p13y + B*p13x) / denom, (A*p13x - B*p13y) / denom);
          double c23_0 = cos(q2[0]+q3[0]);
          double s23_0 = sin(q2[0]+q3[0]);
          double c23_1 = cos(q2[1]+q3[1]);
          double s23_1 = sin(q2[1]+q3[1]);
          q4[0] = atan2(c23_0*x04y - s23_0*x04x, x04x*c23_0 + x04y*s23_0);
          q4[1] = atan2(c23_1*x04y - s23_1*x04x, x04x*c23_1 + x04y*s23_1);
          ////////////////////////////////////////////////////////////////////////////////
          for(int k=0;k<2;k++) {
            if(fabs(q2[k]) < ZERO_THRESH)
              q2[k] = 0.0;
            else if(q2[k] < 0.0) q2[k] += 2.0*PI;
            if(fabs(q4[k]) < ZERO_THRESH)
              q4[k] = 0.0;
            else if(q4[k] < 0.0) q4[k] += 2.0*PI;
            q_sols[num_sols*6+0] = q1[i];    q_sols[num_sols*6+1] = q2[k];
            q_sols[num_sols*6+2] = q3[k];    q_sols[num_sols*6+3] = q4[k];
            q_sols[num_sols*6+4] = q5[i][j]; q_sols[num_sols*6+5] = q6;
            num_sols++;
          }

        }
      }
    }
    return num_sols;
  }